

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall RVO::KdTree::~KdTree(KdTree *this)

{
  KdTree *this_local;
  
  deleteObstacleTree(this,this->obstacleTree_);
  std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::~vector
            (&this->agentTree_);
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~vector(&this->agents_);
  return;
}

Assistant:

KdTree::~KdTree()
	{
		deleteObstacleTree(obstacleTree_);
	}